

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.c
# Opt level: O2

int fec_decode(fec_t *fec,gf *pkts,uint *idxs,uint len)

{
  gf c;
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  gf *b;
  ulong uVar7;
  ulong uVar8;
  gf *a;
  code *pcStack_60;
  fec_t *local_58;
  gf *local_50;
  ulong local_48;
  undefined1 *local_40;
  gf *local_38;
  
  local_38 = pkts;
  if (fec == (fec_t *)0x0) {
    pcStack_60 = fec_pkt_init;
    __assert_fail("fec != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",0xcd,
                  "int fec_decode(fec_t *, gf *, unsigned int *, unsigned int)");
  }
  uVar4 = 0;
  do {
    while( true ) {
      uVar1 = fec->k;
      if (uVar1 <= uVar4) {
        lVar3 = -((ulong)(uVar1 * uVar1) + 0xf & 0xfffffffffffffff0);
        local_50 = (gf *)((long)&local_58 + lVar3);
        *(undefined8 *)((long)&pcStack_60 + lVar3) = 0x1058e2;
        iVar5 = fec_decode_matrix(fec,(gf *)((long)&local_58 + lVar3),idxs);
        if (iVar5 == 0) {
          iVar5 = 0;
        }
        else {
          local_40 = (undefined1 *)&local_58;
          local_48 = (ulong)len;
          local_58 = fec;
          uVar6 = (ulong)fec->k;
          for (uVar7 = 0; uVar8 = local_48, uVar7 < uVar6; uVar7 = uVar7 + 1) {
            if ((uint)uVar6 <= idxs[uVar7]) {
              a = local_38 + (int)uVar7 * len;
              *(undefined8 *)((long)&pcStack_60 + lVar3) = 0x10592a;
              memset(a,0,uVar8);
              uVar8 = 0;
              while( true ) {
                uVar6 = (ulong)local_58->k;
                if (uVar6 <= uVar8) break;
                b = local_38 + idxs[uVar8] * len;
                c = local_50[(int)uVar7 * local_58->k + (int)uVar8];
                *(undefined8 *)((long)&pcStack_60 + lVar3) = 0x10595f;
                gf_add_mul(a,b,c,len);
                uVar8 = uVar8 + 1;
              }
            }
          }
          *(undefined8 *)((long)&pcStack_60 + lVar3) = 1;
          iVar5 = (int)*(undefined8 *)((long)&pcStack_60 + lVar3);
        }
        return iVar5;
      }
      uVar2 = idxs[uVar4];
      if ((uVar1 <= uVar2) || (uVar2 == uVar4)) break;
      if (idxs[uVar2] == uVar2) {
        return 0;
      }
      idxs[uVar4] = idxs[uVar2];
      idxs[uVar2] = uVar2;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int fec_decode(fec_t *fec,
               gf *pkts,
               unsigned int idxs[], unsigned len) {
  assert(fec != NULL);
  
  if (!fec_shuffle(fec, idxs))
    return 0;

  /*M
    Build decoding matrix.
  **/
  gf dec_matrix[fec->k * fec->k];
  if (!fec_decode_matrix(fec, dec_matrix, idxs))
    return 0;

  unsigned int row;
  for (row = 0; row < fec->k; row++) {
    if (idxs[row] >= fec->k) {
      gf *pkt = pkts + row * len;
      
      bzero(pkt, len * sizeof(gf));
      unsigned int col;
      for (col = 0; col < fec->k; col++) {
        gf_add_mul(pkt, pkts + idxs[col] * len,
                   dec_matrix[row * fec->k + col], len);
      }
    }
  }

  return 1;
}